

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildBool16x8_1Int8
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot,
          RegSlot src5RegSlot,RegSlot src6RegSlot,RegSlot src7RegSlot,RegSlot src8RegSlot)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegSlot local_48;
  RegSlot local_44;
  RegSlot srcRegSlots [8];
  uint LANES;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  srcRegSlots[7] = src2RegSlot;
  if (newOpcode != Simd128_IntsToB8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1854,"(newOpcode == Js::OpCodeAsmJs::Simd128_IntsToB8)",
                       "Unexpected opcode for this format.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  srcRegSlots[6] = 8;
  local_44 = srcRegSlots[7];
  srcRegSlots[0] = src3RegSlot;
  srcRegSlots[1] = src4RegSlot;
  srcRegSlots[2] = src5RegSlot;
  srcRegSlots[3] = src6RegSlot;
  srcRegSlots[4] = src7RegSlot;
  srcRegSlots[5] = src8RegSlot;
  local_48 = src1RegSlot;
  BuildSimd_1Ints(this,newOpcode,offset,TySimd128B8,&local_48,dstRegSlot,8);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildBool16x8_1Int8(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG9)
{
    AssertMsg(newOpcode == Js::OpCodeAsmJs::Simd128_IntsToB8, "Unexpected opcode for this format.");

    uint const LANES = 8;
    Js::RegSlot srcRegSlots[LANES];

    srcRegSlots[0] = src1RegSlot;
    srcRegSlots[1] = src2RegSlot;
    srcRegSlots[2] = src3RegSlot;
    srcRegSlots[3] = src4RegSlot;
    srcRegSlots[4] = src5RegSlot;
    srcRegSlots[5] = src6RegSlot;
    srcRegSlots[6] = src7RegSlot;
    srcRegSlots[7] = src8RegSlot;

    BuildSimd_1Ints(newOpcode, offset, TySimd128B8, srcRegSlots, dstRegSlot, LANES);
}